

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s256_30_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar2 = vpbroadcastq_avx512vl();
  lVar1 = 0x40;
  auVar3 = vpternlogq_avx512vl(auVar2,*(undefined1 (*) [32])A->w64,*(undefined1 (*) [32])c->w64,0x6a
                              );
  auVar2 = vpbroadcastq_avx512vl();
  auVar2 = vpand_avx2(auVar2,*(undefined1 (*) [32])A[1].w64);
  do {
    auVar4 = vpbroadcastq_avx512vl();
    auVar5 = vpbroadcastq_avx512vl();
    auVar6 = vpbroadcastq_avx512vl();
    auVar3 = vpternlogq_avx512vl(auVar3,auVar5,*(undefined1 (*) [32])((long)A->w64 + lVar1),0x78);
    auVar2 = vpternlogq_avx512vl(auVar2,auVar4,*(undefined1 (*) [32])((long)A[1].w64 + lVar1),0x78);
    auVar4 = vpbroadcastq_avx512vl();
    auVar3 = vpternlogq_avx512vl(auVar3,auVar6,*(undefined1 (*) [32])((long)A[2].w64 + lVar1),0x78);
    auVar2 = vpternlogq_avx512vl(auVar2,auVar4,*(undefined1 (*) [32])((long)A[3].w64 + lVar1),0x78);
    lVar1 = lVar1 + 0x80;
  } while ((int)lVar1 != 0x3c0);
  *(undefined1 (*) [32])c->w64 = auVar2 ^ auVar3;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  mzd_addmul_v_s256_30_256_idx(c, A, CONST_BLOCK(v, 0)->w64[3] >> 34);
}